

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O3

void __thiscall cmCTestSVN::LogParser::~LogParser(LogParser *this)

{
  ~LogParser(this);
  operator_delete(this,0x1d8);
  return;
}

Assistant:

~LogParser() override { this->CleanupParser(); }